

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

stb_uint64 stb_fget_varlen64(FILE *f)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  
  uVar1 = fgetc((FILE *)f);
  uVar4 = uVar1 & 0xff;
  if (uVar4 < 0x80) {
    uVar3 = (ulong)uVar4;
  }
  else {
    if (uVar4 < 0xc0) {
      uVar3 = (ulong)(uVar4 * 0x100 - 0x8000);
    }
    else {
      if (uVar4 < 0xe0) {
        uVar3 = (ulong)(uVar4 * 0x10000 - 0xc00000);
      }
      else {
        if (uVar4 < 0xf0) {
          uVar3 = (ulong)(uVar1 * 0x1000000 + 0x20000000);
        }
        else {
          if (uVar4 < 0xf8) {
            uVar3 = (ulong)(uVar4 - 0xf0) << 0x20;
          }
          else {
            if (uVar4 < 0xfc) {
              uVar3 = (ulong)(uVar4 + 0xffff08) << 0x28;
            }
            else {
              if (uVar4 < 0xfe) {
                uVar3 = (ulong)(uVar4 + 0xff04) << 0x30;
              }
              else {
                if (uVar4 == 0xff) {
                  uVar1 = fgetc((FILE *)f);
                  uVar3 = (ulong)uVar1 << 0x38;
                }
                else {
                  uVar3 = 0;
                }
                uVar1 = fgetc((FILE *)f);
                uVar3 = (ulong)(uVar1 & 0xff) << 0x30 | uVar3;
              }
              uVar1 = fgetc((FILE *)f);
              uVar3 = (ulong)(uVar1 & 0xff) << 0x28 | uVar3;
            }
            uVar1 = fgetc((FILE *)f);
            uVar3 = (ulong)(uVar1 & 0xff) << 0x20 | uVar3;
          }
          iVar2 = fgetc((FILE *)f);
          uVar3 = (uint)(iVar2 << 0x18) | uVar3;
        }
        uVar1 = fgetc((FILE *)f);
        uVar3 = (uVar1 & 0xff) << 0x10 | uVar3;
      }
      uVar1 = fgetc((FILE *)f);
      uVar3 = (uVar1 & 0xff) << 8 | uVar3;
    }
    uVar1 = fgetc((FILE *)f);
    uVar3 = uVar1 & 0xff | uVar3;
  }
  return -(ulong)((uint)uVar3 & 1) ^ uVar3 >> 1;
}

Assistant:

stb_uint64   stb_fget_varlen64(FILE *f)
{
   stb_uint64 z;
   unsigned char d;
   d = stb_fgetc(f);

   if (d >= 0x80) {
      if (d >= 0xc0) {
         if (d >= 0xe0) {
            if (d >= 0xf0) {
               if (d >= 0xf8) {
                  if (d >= 0xfc) {
                     if (d >= 0xfe) {
                        if (d >= 0xff)
                           z = (stb_uint64) stb_fgetc(f) << 56;
                        else
                           z = (stb_uint64) (d - 0xfe) << 56;
                        z |= (stb_uint64) stb_fgetc(f) << 48;
                     } else z = (stb_uint64) (d - 0xfc) << 48;
                     z |= (stb_uint64) stb_fgetc(f) << 40;
                  } else z = (stb_uint64) (d - 0xf8) << 40;
                  z |= (stb_uint64) stb_fgetc(f) << 32;
               } else z = (stb_uint64) (d - 0xf0) << 32;
               z |= (stb_uint) stb_fgetc(f) << 24;
            } else z = (stb_uint) (d - 0xe0) << 24;
            z |= (stb_uint) stb_fgetc(f) << 16;
         } else z = (stb_uint) (d - 0xc0) << 16;
         z |= (stb_uint) stb_fgetc(f) << 8;
      } else z = (stb_uint) (d - 0x80) << 8;
      z |= stb_fgetc(f);
   } else
      z = d;

   return (z & 1) ? ~(z >> 1) : (z >> 1);
}